

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicRectMatrix.hpp
# Opt level: O2

void __thiscall OpenMD::DynamicRectMatrix<double>::deallocate(DynamicRectMatrix<double> *this)

{
  double **ppdVar1;
  uint i;
  ulong uVar2;
  
  for (uVar2 = 0; ppdVar1 = this->data_, uVar2 < this->nrow_; uVar2 = uVar2 + 1) {
    operator_delete(ppdVar1[uVar2],8);
  }
  if (ppdVar1 != (double **)0x0) {
    operator_delete__(ppdVar1);
  }
  this->data_ = (double **)0x0;
  this->nrow_ = 0;
  this->ncol_ = 0;
  return;
}

Assistant:

void deallocate() {
      for (unsigned int i = 0; i < nrow_; ++i)
        delete data_[i];
      delete[] data_;

      nrow_ = 0;
      ncol_ = 0;
      data_ = NULL;
    }